

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_Object(AMFImporter *this)

{
  size_t *psVar1;
  CAMFImporter_NodeElement *pCVar2;
  CAMFImporter_NodeElement *pCVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *p_Var7;
  undefined8 uVar8;
  undefined8 extraout_RAX;
  undefined8 uVar9;
  undefined8 extraout_RAX_00;
  AMFImporter *this_00;
  char *__end;
  uint uVar10;
  ulong uVar11;
  pointer pcVar12;
  string an;
  string id;
  undefined1 local_a0 [36];
  uint local_7c;
  CAMFImporter_NodeElement *local_78;
  undefined1 *local_70;
  char *local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  local_70 = &local_60;
  local_68 = (char *)0x0;
  local_60 = 0;
  uVar5 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar5) {
    uVar11 = 0;
    do {
      iVar6 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,(char *)CONCAT44(extraout_var,iVar6),
                 (allocator<char> *)&local_50);
      iVar6 = std::__cxx11::string::compare((char *)local_a0);
      if (iVar6 != 0) goto LAB_003d00eb;
      iVar6 = (*this->mReader->_vptr_IIrrXMLReader[6])();
      pcVar4 = local_68;
      strlen((char *)CONCAT44(extraout_var_00,iVar6));
      std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar4,CONCAT44(extraout_var_00,iVar6));
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar5 != uVar10);
  }
  pcVar12 = local_a0 + 0x10;
  local_78 = (CAMFImporter_NodeElement *)operator_new(0x50);
  pCVar2 = this->mNodeElement_Cur;
  local_78->Type = 8;
  (local_78->ID)._M_dataplus._M_p = (pointer)&(local_78->ID).field_2;
  (local_78->ID)._M_string_length = 0;
  (local_78->ID).field_2._M_local_buf[0] = '\0';
  local_78->Parent = pCVar2;
  (local_78->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78->Child;
  (local_78->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&local_78->Child;
  (local_78->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  local_78->_vptr_CAMFImporter_NodeElement = (_func_int **)&PTR__CAMFImporter_NodeElement_007dc760;
  if (local_68 != (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_78->ID);
  }
  iVar6 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  pCVar2 = this->mNodeElement_Cur;
  if ((char)iVar6 == '\0') {
    p_Var7 = (_List_node_base *)operator_new(0x18);
    pCVar3 = local_78;
    p_Var7[1]._M_next = (_List_node_base *)local_78;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    this->mNodeElement_Cur = pCVar3;
    local_7c = 0;
LAB_003cfe58:
    do {
      do {
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar6 == '\0') {
          this_00 = (AMFImporter *)local_a0;
          local_a0._0_8_ = pcVar12;
          std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"object","");
          Throw_CloseNotFound(this_00,(string *)local_a0);
LAB_003d00eb:
          Throw_IncorrectAttr(this,(string *)local_a0);
LAB_003d00f8:
          local_a0._0_8_ = local_a0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"color","");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Only one color can be defined for <object>.","");
          Throw_MoreThanOnceDefined(this,(string *)local_a0,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
            operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
          }
          _Unwind_Resume(extraout_RAX_00);
        }
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar6 == 1) {
          local_a0._0_8_ = pcVar12;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"color","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          uVar8 = std::__cxx11::string::compare((char *)local_a0);
          uVar9 = uVar8;
          if ((pointer)local_a0._0_8_ != pcVar12) {
            operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
            uVar9 = extraout_RAX;
          }
          if ((int)uVar8 == 0) {
            if ((local_7c & 1) != 0) goto LAB_003d00f8;
            local_7c = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
            ParseNode_Color(this);
          }
          else {
            local_a0._0_8_ = pcVar12;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"mesh","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar6 = std::__cxx11::string::compare((char *)local_a0);
            if ((pointer)local_a0._0_8_ != pcVar12) {
              operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
            }
            if (iVar6 == 0) {
              ParseNode_Mesh(this);
            }
            else {
              local_a0._0_8_ = pcVar12;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"metadata","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar6 = std::__cxx11::string::compare((char *)local_a0);
              if ((pointer)local_a0._0_8_ != pcVar12) {
                operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
              }
              if (iVar6 == 0) {
                ParseNode_Metadata(this);
              }
              else {
                local_a0._0_8_ = pcVar12;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"object","");
                XML_CheckNode_SkipUnsupported(this,(string *)local_a0);
                if ((pointer)local_a0._0_8_ != pcVar12) {
                  operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
                }
              }
            }
          }
          goto LAB_003cfe58;
        }
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar6 != 2);
      local_a0._0_8_ = pcVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"object","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar6 = std::__cxx11::string::compare((char *)local_a0);
      if ((pointer)local_a0._0_8_ != pcVar12) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
    } while (iVar6 != 0);
    if (this->mNodeElement_Cur != (CAMFImporter_NodeElement *)0x0) {
      this->mNodeElement_Cur = this->mNodeElement_Cur->Parent;
    }
  }
  else {
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)local_78;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)local_78;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Object()
{
    std::string id;
    CAMFImporter_NodeElement* ne( nullptr );

	// Read attributes for node <object>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("id", id, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create and if needed - define new geometry object.
	ne = new CAMFImporter_NodeElement_Object(mNodeElement_Cur);

	CAMFImporter_NodeElement_Object& als = *((CAMFImporter_NodeElement_Object*)ne);// alias for convenience

	if(!id.empty()) als.ID = id;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool col_read = false;

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("object");
			if(XML_CheckNode_NameEqual("color"))
			{
				// Check if color already defined for object.
				if(col_read) Throw_MoreThanOnceDefined("color", "Only one color can be defined for <object>.");
				// read data and set flag about it
				ParseNode_Color();
				col_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("mesh")) { ParseNode_Mesh(); continue; }
			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("object");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}